

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_connection.cpp
# Opt level: O0

int64_t __thiscall mysqlhs::connection::affected_rows(connection *this)

{
  long lVar1;
  char *__nptr;
  long in_RDI;
  size_type found;
  string local_38 [32];
  undefined8 local_18;
  longlong local_8;
  
  if ((*(int *)(in_RDI + 0xc) == 3) || (*(int *)(in_RDI + 0xc) == 4)) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      local_8 = -1;
    }
    else {
      local_18 = std::__cxx11::string::find_last_of((char *)(in_RDI + 0x10),0x1131f3);
      std::__cxx11::string::substr((ulong)local_38,in_RDI + 0x10);
      __nptr = (char *)std::__cxx11::string::c_str();
      local_8 = strtoll(__nptr,(char **)0x0,0);
      std::__cxx11::string::~string(local_38);
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

int64_t connection::affected_rows()
	{
		if (query_type_ != query_type::update_ && query_type_ != query_type::delete_)
		{
			return -1;
		}

		if (raw_data_.size() < 1)
		{
			return -1;
		}

		auto found = raw_data_.find_last_of("\t");
		return strtoll(raw_data_.substr(found + 1).c_str(), nullptr, 0);
	}